

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QtPrivate::QCalendarView::wheelEvent(QCalendarView *this,QWheelEvent *event)

{
  int iVar1;
  QCalendarModel *this_00;
  long in_FS_OFFSET;
  qint64 local_50;
  undefined8 local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(event + 0x5c);
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_48,(QAbstractItemView *)this);
  this_00 = (QCalendarModel *)QAbstractItemView::model((QAbstractItemView *)this);
  local_50 = (qint64)QCalendarModel::dateForCell(this_00,(int)local_48,local_48._4_4_);
  local_50 = QDate::addMonths(&local_50,(long)iVar1 / -0x78 & 0xffffffff,
                              *(undefined8 *)&this_00->m_calendar);
  showDate(this,(QDate)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarView::wheelEvent(QWheelEvent *event)
{
    const int numDegrees = event->angleDelta().y() / 8;
    const int numSteps = numDegrees / 15;
    const QModelIndex index = currentIndex();
    QCalendarModel *calendarModel = static_cast<QCalendarModel*>(model());
    QDate currentDate = calendarModel->dateForCell(index.row(), index.column());
    currentDate = currentDate.addMonths(-numSteps, calendarModel->calendar());
    emit showDate(currentDate);
}